

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

bool __thiscall cmsys::RegularExpression::deep_equal(RegularExpression *this,RegularExpression *rxp)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (this->progsize == rxp->progsize) {
    lVar3 = (long)this->progsize;
    do {
      if (lVar3 == 0) {
        return rxp->endp[0] == this->endp[0] && this->startp[0] == rxp->startp[0];
      }
      lVar1 = lVar3 + -1;
      lVar2 = lVar3 + -1;
      lVar3 = lVar3 + -1;
    } while (this->program[lVar1] == rxp->program[lVar2]);
  }
  return false;
}

Assistant:

bool RegularExpression::deep_equal(const RegularExpression& rxp) const
{
  int ind = this->progsize;                     // Get regular expression size
  if (ind != rxp.progsize)                      // If different size regexp
    return false;                               // Return failure
  while (ind-- != 0)                            // Else while still characters
    if (this->program[ind] != rxp.program[ind]) // If regexp are different
      return false;                             // Return failure
  return (this->startp[0] == rxp.startp[0] &&   // Else if same start/end ptrs,
          this->endp[0] == rxp.endp[0]);        // Return true
}